

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ThreadSafeArena::SetInitialBlock
          (ThreadSafeArena *this,void *mem,size_t size)

{
  size_t sVar1;
  SerialArena *pSVar2;
  void *in_RCX;
  size_t *in_FS_OFFSET;
  Memory mem_00;
  
  sVar1 = *in_FS_OFFSET;
  mem_00.size = sVar1;
  mem_00.ptr = (void *)size;
  pSVar2 = SerialArena::New((SerialArena *)mem,mem_00,in_RCX);
  pSVar2->next_ = (SerialArena *)0x0;
  *(SerialArena **)(this + 0x10) = pSVar2;
  *(SerialArena **)(sVar1 + 0x10) = pSVar2;
  *(undefined8 *)(sVar1 + 8) = *(undefined8 *)this;
  *(SerialArena **)(this + 0x18) = pSVar2;
  return;
}

Assistant:

void ThreadSafeArena::SetInitialBlock(void* mem, size_t size) {
  SerialArena* serial = SerialArena::New({mem, size}, &thread_cache());
  serial->set_next(NULL);
  threads_.store(serial, std::memory_order_relaxed);
  CacheSerialArena(serial);
}